

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  float *scanline;
  undefined2 uVar1;
  undefined4 uVar2;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar8;
  stbtt__point sVar3;
  stbtt__point sVar4;
  undefined4 uVar7;
  stbtt_uint8 sVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  undefined4 uVar17;
  undefined1 uVar20;
  stbtt_uint8 *data;
  undefined6 uVar21;
  undefined4 uVar22;
  stbtt__active_edge *psVar18;
  ImFont *font;
  stbtt_packedchar *psVar19;
  stbrp_node *psVar23;
  short sVar24;
  short sVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [14];
  unkuint10 Var29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  unkbyte10 Var32;
  undefined1 auVar33 [13];
  undefined1 auVar34 [11];
  undefined1 auVar35 [15];
  undefined1 auVar36 [14];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  uint6 uVar42;
  ImFontBuildSrcData *pIVar43;
  stbrp_rect *psVar44;
  stbtt_uint32 sVar45;
  stbtt_uint32 sVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  stbtt__active_edge *z;
  stbtt_uint32 sVar46;
  stbtt_uint32 sVar47;
  stbtt_uint32 sVar48;
  stbtt_uint32 sVar49;
  stbtt_uint32 sVar50;
  stbtt_uint32 sVar51;
  ImFontBuildDstData *pIVar57;
  ushort *puVar58;
  uint *puVar59;
  stbrp_context *ptr;
  uchar *puVar60;
  void *ptr_00;
  stbtt__edge *p_00;
  float *scanline_00;
  undefined8 *puVar61;
  stbtt__active_edge *psVar62;
  stbtt_uint32 *psVar63;
  ushort uVar64;
  ushort uVar65;
  int output_i;
  uint uVar66;
  long lVar67;
  ImWchar *pIVar68;
  ulong uVar69;
  stbtt__active_edge *psVar70;
  float *pfVar71;
  int mask;
  uint uVar74;
  uint uVar72;
  stbtt__edge *psVar73;
  int iVar75;
  void *p;
  ulong uVar76;
  long lVar77;
  stbtt__active_edge *psVar78;
  uchar *puVar79;
  byte *pbVar80;
  int *piVar81;
  stbtt_uint32 encoding_record;
  uint uVar82;
  ulong uVar83;
  stbtt__edge *psVar84;
  long lVar85;
  ulong uVar86;
  ulong uVar87;
  uchar *puVar88;
  byte *pbVar89;
  ImFontConfig *pIVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int src_i_1;
  int iVar94;
  stbrp_rect *psVar95;
  int *it;
  uint *puVar96;
  ImFontAtlas *pIVar97;
  int dst_i;
  int iVar98;
  ImFontBuildSrcData *pIVar99;
  long lVar100;
  uchar *puVar101;
  int codepoint;
  bool bVar102;
  float sum;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined4 uVar112;
  undefined4 uVar113;
  undefined1 extraout_var [12];
  undefined4 uVar114;
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  float in_XMM3_Da;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar122 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  stbtt__buf sVar126;
  float y0_2;
  int local_490;
  int y1;
  ImFontAtlas *local_488;
  stbtt_uint32 charstrings;
  ImVector<ImFontBuildSrcData> src_tmp_array;
  uint local_458;
  stbtt__point *local_420;
  stbtt_uint32 fdarrayoff;
  undefined4 uStack_414;
  int local_410;
  float local_40c;
  ImVector<stbrp_rect> buf_rects;
  ImVector<ImFontBuildDstData> dst_tmp_array;
  ImVector<stbtt_packedchar> buf_packedchars;
  undefined8 *local_3c0;
  int y0_1;
  int x0_1;
  int iy0;
  stbrp_context *local_358;
  long local_350;
  long local_348;
  stbrp_rect *local_340;
  stbtt_packedchar *local_338;
  long local_330;
  long local_328;
  stbtt__edge *local_320;
  ulong local_318;
  ulong local_310;
  float local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  stbrp_node *local_2f0;
  ImFontConfig *local_2e8;
  long local_2e0;
  uchar *local_2d8;
  long local_2d0;
  long local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  int local_2b0;
  int x1_1;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  float local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  int x0;
  undefined4 uStack_234;
  uint uStack_230;
  uint uStack_22c;
  undefined1 auVar107 [16];
  char cVar110;
  char cVar111;
  
  ImFontAtlasBuildRegisterDefaultCustomRects(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  src_tmp_array.Size = 0;
  src_tmp_array.Capacity = 0;
  src_tmp_array.Data = (ImFontBuildSrcData *)0x0;
  dst_tmp_array.Size = 0;
  dst_tmp_array.Capacity = 0;
  dst_tmp_array.Data = (ImFontBuildDstData *)0x0;
  ImVector<ImFontBuildSrcData>::resize(&src_tmp_array,(atlas->ConfigData).Size);
  ImVector<ImFontBuildDstData>::resize(&dst_tmp_array,(atlas->Fonts).Size);
  memset(src_tmp_array.Data,0,(long)src_tmp_array.Size * 0x110);
  memset(dst_tmp_array.Data,0,(long)dst_tmp_array.Size << 5);
  lVar77 = 0;
  local_488 = atlas;
  while (pIVar99 = src_tmp_array.Data, local_2e0 = (long)(local_488->ConfigData).Size,
        local_350 = lVar77, lVar77 < local_2e0) {
    pIVar90 = (local_488->ConfigData).Data + lVar77;
    src_tmp_array.Data[lVar77].DstIndex = -1;
    iVar53 = (local_488->Fonts).Size;
    lVar67 = 0;
    lVar100 = -1;
    while ((iVar54 = (int)lVar100, lVar67 < iVar53 && (iVar54 == -1))) {
      lVar100 = -1;
      if (pIVar90->DstFont == (local_488->Fonts).Data[lVar67]) {
        src_tmp_array.Data[lVar77].DstIndex = (int)lVar67;
        lVar100 = lVar67;
      }
      lVar67 = lVar67 + 1;
    }
    if (iVar54 == -1) goto LAB_00132469;
    data = (stbtt_uint8 *)pIVar90->FontData;
    iVar53 = pIVar90->FontNo;
    sVar9 = *data;
    if (sVar9 == '\0') {
      sVar52 = 0xffffffff;
      if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_0012fde6;
LAB_0012fddc:
      sVar52 = -(uint)(iVar53 != 0);
    }
    else {
      sVar52 = 0xffffffff;
      if (sVar9 == 't') {
        sVar9 = data[1];
        if (sVar9 == 'r') {
          if (data[2] == 'u') {
            bVar102 = data[3] == 'e';
            goto LAB_0012fdd8;
          }
        }
        else if (sVar9 == 't') {
          if (((data[2] == 'c') && (data[3] == 'f')) &&
             (((sVar45 = ttULONG(data + 4), sVar45 == 0x20000 || (sVar45 == 0x10000)) &&
              (uVar82 = *(uint *)(data + 8),
              iVar53 < (int)(uVar82 >> 0x18 | (uVar82 & 0xff0000) >> 8 | (uVar82 & 0xff00) << 8 |
                            uVar82 << 0x18))))) {
            sVar52 = ttULONG(data + (long)iVar53 * 4 + 0xc);
          }
        }
        else if ((sVar9 == 'y') && (data[2] == 'p')) {
          bVar102 = data[3] == '1';
          goto LAB_0012fdd8;
        }
      }
      else if (sVar9 == 'O') {
        if ((data[1] == 'T') && (data[2] == 'T')) {
          bVar102 = data[3] == 'O';
          goto LAB_0012fdd8;
        }
      }
      else if (((sVar9 == '1') && (data[1] == '\0')) && (data[2] == '\0')) {
        bVar102 = data[3] == '\0';
LAB_0012fdd8:
        if (bVar102) goto LAB_0012fddc;
      }
    }
LAB_0012fde6:
    pIVar99[lVar77].FontInfo.data = data;
    pIVar99[lVar77].FontInfo.fontstart = sVar52;
    pIVar99[lVar77].FontInfo.cff.data = (uchar *)0x0;
    pIVar99[lVar77].FontInfo.cff.cursor = 0;
    pIVar99[lVar77].FontInfo.cff.size = 0;
    sVar45 = stbtt__find_table(data,sVar52,"cmap");
    sVar46 = stbtt__find_table(data,sVar52,"loca");
    pIVar99[lVar77].FontInfo.loca = sVar46;
    sVar47 = stbtt__find_table(data,sVar52,"head");
    pIVar99[lVar77].FontInfo.head = sVar47;
    sVar48 = stbtt__find_table(data,sVar52,"glyf");
    pIVar99[lVar77].FontInfo.glyf = sVar48;
    sVar49 = stbtt__find_table(data,sVar52,"hhea");
    pIVar99[lVar77].FontInfo.hhea = sVar49;
    sVar50 = stbtt__find_table(data,sVar52,"hmtx");
    pIVar99[lVar77].FontInfo.hmtx = sVar50;
    sVar51 = stbtt__find_table(data,sVar52,"kern");
    pIVar99[lVar77].FontInfo.kern = sVar51;
    sVar51 = stbtt__find_table(data,sVar52,"GPOS");
    pIVar99[lVar77].FontInfo.gpos = sVar51;
    if (((sVar45 == 0) || (sVar47 == 0)) || ((sVar49 == 0 || (sVar50 == 0)))) goto LAB_00132469;
    if (sVar48 == 0) {
      _charstrings = (stbtt__active_edge *)((ulong)_charstrings & 0xffffffff00000000);
      fdarrayoff = 0;
      buf_packedchars.Size = 2;
      y1 = 0;
      sVar46 = stbtt__find_table(data,sVar52,"CFF ");
      if (sVar46 == 0) goto LAB_00132469;
      pIVar99[lVar77].FontInfo.fdselect.data = (uchar *)0x0;
      pIVar99[lVar77].FontInfo.fdselect.cursor = 0;
      pIVar99[lVar77].FontInfo.fdselect.size = 0;
      pIVar99[lVar77].FontInfo.fontdicts.data = (uchar *)0x0;
      pIVar99[lVar77].FontInfo.fontdicts.cursor = 0;
      pIVar99[lVar77].FontInfo.fontdicts.size = 0;
      pIVar99[lVar77].FontInfo.cff.data = data + sVar46;
      pIVar99[lVar77].FontInfo.cff.cursor = 0;
      pIVar99[lVar77].FontInfo.cff.size = 0x20000000;
      puVar60 = pIVar99[lVar77].FontInfo.cff.data;
      uVar26 = pIVar99[lVar77].FontInfo.cff.cursor;
      uVar27 = pIVar99[lVar77].FontInfo.cff.size;
      x0 = (int)puVar60;
      uStack_234 = (undefined4)((ulong)puVar60 >> 0x20);
      uVar82 = uVar26 + 2;
      if ((int)uVar27 < (int)(uVar26 + 2)) {
        uVar82 = uVar27;
      }
      if ((int)uVar26 < -2) {
        uVar82 = uVar27;
      }
      uStack_230 = 0;
      if ((int)uVar82 < (int)uVar27) {
        uStack_230 = (uint)puVar60[(int)uVar82];
      }
      if ((int)uVar27 < (int)uStack_230) {
        uStack_230 = uVar27;
      }
      uStack_22c = uVar27;
      stbtt__cff_get_index((stbtt__buf *)&x0);
      sVar126 = stbtt__cff_get_index((stbtt__buf *)&x0);
      buf_rects = (ImVector<stbrp_rect>)stbtt__cff_index_get(sVar126,0);
      stbtt__cff_get_index((stbtt__buf *)&x0);
      sVar126 = stbtt__cff_get_index((stbtt__buf *)&x0);
      pIVar99[lVar77].FontInfo.gsubrs = sVar126;
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x11,1,&charstrings);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x106,1,(stbtt_uint32 *)&buf_packedchars);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x124,1,&fdarrayoff);
      stbtt__dict_get_ints((stbtt__buf *)&buf_rects,0x125,1,(stbtt_uint32 *)&y1);
      uVar82 = uStack_22c;
      sVar126.data._4_4_ = uStack_234;
      sVar126.data._0_4_ = x0;
      sVar126.cursor = uStack_230;
      sVar126.size = uStack_22c;
      sVar126 = stbtt__get_subrs(sVar126,(stbtt__buf)buf_rects);
      iVar53 = y1;
      pIVar99[lVar77].FontInfo.subrs = sVar126;
      if ((buf_packedchars.Size != 2) || (sVar46 = charstrings, charstrings == 0))
      goto LAB_00132469;
      if (fdarrayoff != 0) {
        if (y1 == 0) goto LAB_00132469;
        uStack_230 = fdarrayoff;
        if ((int)uVar82 < (int)fdarrayoff) {
          uStack_230 = uVar82;
        }
        if ((int)fdarrayoff < 0) {
          uStack_230 = uVar82;
        }
        sVar126 = stbtt__cff_get_index((stbtt__buf *)&x0);
        uVar82 = uStack_22c;
        pIVar99[lVar77].FontInfo.fontdicts = sVar126;
        sVar126 = stbtt__buf_range((stbtt__buf *)&x0,iVar53,uStack_22c - iVar53);
        pIVar99[lVar77].FontInfo.fdselect = sVar126;
      }
      uStack_230 = sVar46;
      if ((int)uVar82 < (int)sVar46) {
        uStack_230 = uVar82;
      }
      if ((int)sVar46 < 0) {
        uStack_230 = uVar82;
      }
      sVar126 = stbtt__cff_get_index((stbtt__buf *)&x0);
      pIVar99[lVar77].FontInfo.charstrings = sVar126;
    }
    else if (sVar46 == 0) goto LAB_00132469;
    sVar52 = stbtt__find_table(data,sVar52,"maxp");
    if (sVar52 == 0) {
      uVar82 = 0xffff;
    }
    else {
      uVar82 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar52 + 4) << 8 |
                             *(ushort *)(data + (ulong)sVar52 + 4) >> 8);
    }
    pIVar99[lVar77].FontInfo.numGlyphs = uVar82;
    uVar64 = *(ushort *)(data + (ulong)sVar45 + 2);
    pIVar99[lVar77].FontInfo.index_map = 0;
    uVar76 = (ulong)(ushort)(uVar64 << 8 | uVar64 >> 8);
    uVar82 = sVar45 + 4;
    iVar53 = 0;
    while (bVar102 = uVar76 != 0, uVar76 = uVar76 - 1, bVar102) {
      uVar64 = *(ushort *)(data + uVar82) << 8 | *(ushort *)(data + uVar82) >> 8;
      if ((uVar64 == 0) ||
         ((uVar64 == 3 &&
          ((uVar64 = *(ushort *)(data + (ulong)uVar82 + 2) << 8 |
                     *(ushort *)(data + (ulong)uVar82 + 2) >> 8, uVar64 == 10 || (uVar64 == 1))))))
      {
        sVar52 = ttULONG(data + (ulong)uVar82 + 4);
        iVar53 = sVar52 + sVar45;
        pIVar99[lVar77].FontInfo.index_map = iVar53;
      }
      uVar82 = uVar82 + 8;
    }
    if (iVar53 == 0) goto LAB_00132469;
    pIVar99[lVar77].FontInfo.indexToLocFormat =
         (uint)(ushort)(*(ushort *)(data + (long)(int)sVar47 + 0x32) << 8 |
                       *(ushort *)(data + (long)(int)sVar47 + 0x32) >> 8);
    pIVar57 = dst_tmp_array.Data + iVar54;
    pIVar68 = pIVar90->GlyphRanges;
    if (pIVar68 == (ImWchar *)0x0) {
      pIVar68 = ImFontAtlas::GetGlyphRangesDefault::ranges;
    }
    pIVar99[lVar77].SrcRanges = pIVar68;
    for (; *pIVar68 != 0; pIVar68 = pIVar68 + 2) {
      uVar64 = pIVar68[1];
      uVar82 = pIVar99[lVar77].GlyphsHighest;
      if (uVar64 == 0) goto LAB_0013026d;
      uVar72 = (uint)uVar64;
      if ((int)(uint)uVar64 < (int)uVar82) {
        uVar72 = uVar82;
      }
      pIVar99[lVar77].GlyphsHighest = uVar72;
    }
    uVar82 = pIVar99[lVar77].GlyphsHighest;
LAB_0013026d:
    pIVar57->SrcCount = pIVar57->SrcCount + 1;
    if ((int)uVar82 < pIVar57->GlyphsHighest) {
      uVar82 = pIVar57->GlyphsHighest;
    }
    pIVar57->GlyphsHighest = uVar82;
    lVar77 = local_350 + 1;
  }
  lVar77 = 0;
  iVar53 = 0;
  while( true ) {
    pIVar99 = src_tmp_array.Data;
    uVar76 = (ulong)src_tmp_array.Size;
    if ((long)uVar76 <= lVar77) break;
    pIVar57 = dst_tmp_array.Data + src_tmp_array.Data[lVar77].DstIndex;
    pIVar90 = (local_488->ConfigData).Data;
    ImBoolVector::Resize
              (&src_tmp_array.Data[lVar77].GlyphsSet,src_tmp_array.Data[lVar77].GlyphsHighest + 1);
    if ((1 < pIVar57->SrcCount) && (*(int *)&pIVar57->GlyphsSet == 0)) {
      ImBoolVector::Resize(&pIVar57->GlyphsSet,pIVar57->GlyphsHighest + 1);
    }
    pIVar99 = pIVar99 + lVar77;
    for (puVar58 = pIVar99->SrcRanges;
        (uVar82 = (uint)*puVar58, *puVar58 != 0 && (uVar64 = puVar58[1], uVar64 != 0));
        puVar58 = puVar58 + 2) {
      for (; uVar82 <= uVar64; uVar82 = uVar82 + 1) {
        if (((pIVar90[lVar77].MergeMode != true) ||
            ((*(uint *)(*(long *)&pIVar57->field_0x18 + (ulong)(uVar82 >> 5) * 4) >> (uVar82 & 0x1f)
             & 1) == 0)) && (iVar54 = stbtt_FindGlyphIndex(&pIVar99->FontInfo,uVar82), iVar54 != 0))
        {
          pIVar99->GlyphsCount = pIVar99->GlyphsCount + 1;
          pIVar57->GlyphsCount = pIVar57->GlyphsCount + 1;
          uVar72 = 1 << ((byte)uVar82 & 0x1f);
          puVar96 = (uint *)(*(long *)&pIVar99->field_0xf8 + (ulong)(uVar82 >> 5) * 4);
          *puVar96 = *puVar96 | uVar72;
          if (1 < pIVar57->SrcCount) {
            puVar96 = (uint *)(*(long *)&pIVar57->field_0x18 + (ulong)(uVar82 >> 5) * 4);
            *puVar96 = *puVar96 | uVar72;
          }
          iVar53 = iVar53 + 1;
        }
      }
    }
    lVar77 = lVar77 + 1;
  }
  for (lVar77 = 0; pIVar99 = src_tmp_array.Data, pIVar97 = local_488, lVar77 < (int)uVar76;
      lVar77 = lVar77 + 1) {
    pIVar43 = src_tmp_array.Data + lVar77;
    ImVector<int>::reserve(&pIVar43->GlyphsList,src_tmp_array.Data[lVar77].GlyphsCount);
    puVar96 = *(uint **)&pIVar99[lVar77].field_0xf8;
    puVar59 = puVar96 + *(int *)&pIVar99[lVar77].GlyphsSet;
    iVar54 = 0;
    for (; puVar96 < puVar59; puVar96 = puVar96 + 1) {
      uVar82 = *puVar96;
      if (uVar82 != 0) {
        for (uVar72 = 0; uVar72 != 0x20; uVar72 = uVar72 + 1) {
          if ((uVar82 >> (uVar72 & 0x1f) & 1) != 0) {
            x0 = iVar54 + uVar72;
            ImVector<int>::push_back(&pIVar43->GlyphsList,&x0);
          }
        }
      }
      iVar54 = iVar54 + 0x20;
    }
    ImVector<int>::clear((ImVector<int> *)&pIVar99[lVar77].GlyphsSet);
    uVar76 = src_tmp_array._0_8_ & 0xffffffff;
  }
  lVar77 = 0x10;
  for (lVar100 = 0; lVar100 < dst_tmp_array.Size; lVar100 = lVar100 + 1) {
    ImVector<int>::clear((ImVector<int> *)((long)&(dst_tmp_array.Data)->SrcCount + lVar77));
    lVar77 = lVar77 + 0x20;
  }
  ImVector<ImFontBuildDstData>::clear(&dst_tmp_array);
  buf_rects = (ImVector<stbrp_rect>)ZEXT816(0);
  buf_packedchars.Size = 0;
  buf_packedchars.Capacity = 0;
  buf_packedchars.Data = (stbtt_packedchar *)0x0;
  ImVector<stbrp_rect>::resize(&buf_rects,iVar53);
  ImVector<stbtt_packedchar>::resize(&buf_packedchars,iVar53);
  memset(buf_rects.Data,0,(long)buf_rects.Size << 4);
  memset(buf_packedchars.Data,0,(long)buf_packedchars.Size * 0x1c);
  iVar54 = 0;
  iVar53 = 0;
  local_458 = 0;
  for (lVar77 = 0; lVar77 < src_tmp_array.Size; lVar77 = lVar77 + 1) {
    iVar56 = src_tmp_array.Data[lVar77].GlyphsCount;
    if (iVar56 != 0) {
      pIVar99 = src_tmp_array.Data + lVar77;
      pIVar99->Rects = buf_rects.Data + iVar53;
      pIVar99->PackedChars = buf_packedchars.Data + iVar54;
      pIVar90 = (pIVar97->ConfigData).Data;
      fVar103 = pIVar90[lVar77].SizePixels;
      (pIVar99->PackRange).font_size = fVar103;
      (pIVar99->PackRange).first_unicode_codepoint_in_range = 0;
      (pIVar99->PackRange).array_of_unicode_codepoints = (pIVar99->GlyphsList).Data;
      iVar55 = (pIVar99->GlyphsList).Size;
      (pIVar99->PackRange).num_chars = iVar55;
      (pIVar99->PackRange).chardata_for_range = buf_packedchars.Data + iVar54;
      (pIVar99->PackRange).h_oversample = (uchar)pIVar90[lVar77].OversampleH;
      (pIVar99->PackRange).v_oversample = (uchar)pIVar90[lVar77].OversampleV;
      if (fVar103 <= 0.0) {
        uVar64 = *(ushort *)((pIVar99->FontInfo).data + (long)(pIVar99->FontInfo).head + 0x12);
        fVar103 = -fVar103 / (float)(ushort)(uVar64 << 8 | uVar64 >> 8);
      }
      else {
        fVar103 = stbtt_ScaleForPixelHeight(&pIVar99->FontInfo,fVar103);
      }
      iVar53 = iVar53 + iVar56;
      iVar54 = iVar54 + iVar56;
      iVar56 = pIVar97->TexGlyphPadding;
      lVar100 = 6;
      for (lVar67 = 0; pIVar97 = local_488, lVar67 < iVar55; lVar67 = lVar67 + 1) {
        iVar55 = stbtt_FindGlyphIndex(&pIVar99->FontInfo,(pIVar99->GlyphsList).Data[lVar67]);
        stbtt_GetGlyphBitmapBoxSubpixel
                  (&pIVar99->FontInfo,iVar55,(float)pIVar90[lVar77].OversampleH * fVar103,
                   (float)pIVar90[lVar77].OversampleV * fVar103,fVar103,in_XMM3_Da,&x0,
                   (int *)&charstrings,(int *)&fdarrayoff,&y1);
        uVar82 = (pIVar90[lVar77].OversampleH + ((fdarrayoff + iVar56) - x0)) - 1;
        psVar95 = pIVar99->Rects;
        *(short *)((long)psVar95 + lVar100 + -2) = (short)uVar82;
        uVar72 = (pIVar90[lVar77].OversampleV + ((y1 + iVar56) - charstrings)) - 1;
        *(short *)((long)&psVar95->id + lVar100) = (short)uVar72;
        local_458 = local_458 + (uVar72 & 0xffff) * (uVar82 & 0xffff);
        iVar55 = (pIVar99->GlyphsList).Size;
        lVar100 = lVar100 + 0x10;
      }
    }
  }
  pIVar97->TexHeight = 0;
  local_490 = pIVar97->TexDesiredWidth;
  if (local_490 < 1) {
    iVar53 = (int)SQRT((float)(int)local_458);
    local_490 = 0x1000;
    if ((iVar53 < 0xb33) && (local_490 = 0x800, iVar53 < 0x599)) {
      local_490 = (uint)(0x2cb < iVar53) * 0x200 + 0x200;
    }
  }
  pIVar97->TexWidth = local_490;
  uVar82 = pIVar97->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar53 = local_490 - uVar82;
  local_2f0 = (stbrp_node *)ImGui::MemAlloc((long)iVar53 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_2f0 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_2f0 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_2f0);
    }
    local_2f0 = (stbrp_node *)0x0;
    uVar82 = 0;
    local_490 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    uVar72 = iVar53 - 1;
    uVar83 = 0;
    psVar23 = local_2f0;
    uVar76 = uVar83;
    if (0 < (int)uVar72) {
      uVar83 = (ulong)uVar72;
      uVar76 = uVar83;
    }
    while( true ) {
      bVar102 = uVar83 == 0;
      uVar83 = uVar83 - 1;
      if (bVar102) break;
      psVar23->next = psVar23 + 1;
      psVar23 = psVar23 + 1;
    }
    local_2f0[uVar76].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_2f0;
    ptr->active_head = ptr->extra;
    ptr->width = iVar53;
    ptr->height = 0x8000 - uVar82;
    ptr->num_nodes = iVar53;
    ptr->align = (int)(uVar72 + iVar53) / iVar53;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar53;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_358 = ptr;
  ImFontAtlasBuildPackCustomRects(pIVar97,ptr);
  for (lVar77 = 0; pIVar99 = src_tmp_array.Data, lVar77 < src_tmp_array.Size; lVar77 = lVar77 + 1) {
    if (src_tmp_array.Data[lVar77].GlyphsCount != 0) {
      stbrp_pack_rects(local_358,src_tmp_array.Data[lVar77].Rects,
                       src_tmp_array.Data[lVar77].GlyphsCount);
      uVar72 = pIVar99[lVar77].GlyphsCount;
      if ((int)uVar72 < 1) {
        uVar72 = 0;
      }
      for (lVar100 = 0; (ulong)uVar72 * 0x10 != lVar100; lVar100 = lVar100 + 0x10) {
        psVar95 = pIVar99[lVar77].Rects;
        if (*(int *)((long)&psVar95->was_packed + lVar100) != 0) {
          iVar53 = (uint)*(ushort *)((long)&psVar95->h + lVar100) +
                   (uint)*(ushort *)((long)&psVar95->y + lVar100);
          if (iVar53 < pIVar97->TexHeight) {
            iVar53 = pIVar97->TexHeight;
          }
          pIVar97->TexHeight = iVar53;
        }
      }
    }
  }
  uVar72 = pIVar97->TexHeight;
  if ((pIVar97->Flags & 1) == 0) {
    uVar72 = (int)(uVar72 - 1) >> 1 | uVar72 - 1;
    uVar72 = (int)uVar72 >> 2 | uVar72;
    uVar72 = (int)uVar72 >> 4 | uVar72;
    uVar72 = (int)uVar72 >> 8 | uVar72;
    uVar72 = (int)uVar72 >> 0x10 | uVar72;
  }
  iVar53 = uVar72 + 1;
  pIVar97->TexHeight = iVar53;
  auVar116._0_4_ = (float)pIVar97->TexWidth;
  auVar116._4_4_ = (float)iVar53;
  auVar116._8_8_ = 0;
  auVar116 = divps(_DAT_001869f0,auVar116);
  pIVar97->TexUvScale = auVar116._0_8_;
  puVar60 = (uchar *)ImGui::MemAlloc((long)(iVar53 * pIVar97->TexWidth));
  pIVar97->TexPixelsAlpha8 = puVar60;
  lVar100 = 0;
  memset(puVar60,0,(long)pIVar97->TexHeight * (long)pIVar97->TexWidth);
  puVar60 = pIVar97->TexPixelsAlpha8;
  lVar77 = (long)local_490;
  local_278 = pshuflw(ZEXT416(uVar82),ZEXT416(uVar82),0);
  local_2d8 = puVar60 + 1;
  auVar116 = ZEXT816(0);
  while (lVar100 < src_tmp_array.Size) {
    local_348 = lVar100;
    if (src_tmp_array.Data[lVar100].GlyphsCount != 0) {
      local_2e8 = (local_488->ConfigData).Data;
      pIVar99 = src_tmp_array.Data + lVar100;
      psVar95 = pIVar99->Rects;
      bVar102 = true;
      lVar100 = 0;
      local_340 = psVar95;
      while( true ) {
        uVar114 = 0x80000000;
        uVar113 = 0x80000000;
        uVar112 = 0x80000000;
        if (!bVar102) break;
        fVar103 = (pIVar99->PackRange).font_size;
        if (fVar103 <= 0.0) {
          uVar64 = *(ushort *)((pIVar99->FontInfo).data + (long)(pIVar99->FontInfo).head + 0x12);
          local_248 = -fVar103 / (float)(ushort)(uVar64 << 8 | uVar64 >> 8);
        }
        else {
          local_248 = stbtt_ScaleForPixelHeight(&pIVar99->FontInfo,fVar103);
          auVar116 = ZEXT816(0);
          uVar112 = extraout_var._0_4_;
          uVar113 = extraout_var._4_4_;
          uVar114 = extraout_var._8_4_;
        }
        uVar76._0_1_ = (pIVar99->PackRange).h_oversample;
        uVar20 = (pIVar99->PackRange).v_oversample;
        uVar21 = *(undefined6 *)&(pIVar99->PackRange).field_0x22;
        uVar76._1_7_ = CONCAT61(uVar21,uVar20);
        auVar35._8_6_ = 0;
        auVar35._0_8_ = uVar76;
        auVar35[0xe] = (char)((uint6)uVar21 >> 0x28);
        auVar37._8_4_ = 0;
        auVar37._0_8_ = uVar76;
        auVar37[0xc] = (char)((uint6)uVar21 >> 0x20);
        auVar37._13_2_ = auVar35._13_2_;
        auVar38._8_4_ = 0;
        auVar38._0_8_ = uVar76;
        auVar38._12_3_ = auVar37._12_3_;
        auVar39._8_2_ = 0;
        auVar39._0_8_ = uVar76;
        auVar39[10] = (char)((uint6)uVar21 >> 0x18);
        auVar39._11_4_ = auVar38._11_4_;
        auVar40._8_2_ = 0;
        auVar40._0_8_ = uVar76;
        auVar40._10_5_ = auVar39._10_5_;
        auVar41[8] = (char)((uint6)uVar21 >> 0x10);
        auVar41._0_8_ = uVar76;
        auVar41._9_6_ = auVar40._9_6_;
        cVar111 = (char)((uint6)uVar21 >> 8);
        Var29 = CONCAT91((unkuint9)auVar41._8_7_ << 8,cVar111);
        auVar34[10] = 0;
        auVar34._0_10_ = Var29;
        cVar110 = (char)uVar21;
        auVar107._0_4_ = (uint)uVar76;
        auVar107[4] = cVar110;
        auVar107._5_11_ = auVar34 << 8;
        auVar33[0xc] = 0;
        auVar33._0_12_ = auVar107._4_12_;
        auVar28._1_13_ = auVar33 << 8;
        auVar28[0] = uVar20;
        auVar106._0_2_ = CONCAT11(0,(undefined1)uVar76);
        auVar106._2_14_ = auVar28;
        uVar64 = auVar28._0_2_;
        sVar24 = -auVar107._4_2_;
        uVar65 = (ushort)Var29;
        sVar25 = -uVar65;
        auVar36._10_2_ = 0;
        auVar36._0_10_ = auVar106._0_10_;
        auVar36._12_2_ = uVar65;
        uVar42 = CONCAT42(auVar36._10_4_,auVar107._4_2_);
        auVar30._2_10_ = (unkuint10)uVar42 << 0x10;
        auVar30._0_2_ = uVar64;
        auVar108._0_4_ = (float)auVar106._0_2_;
        auVar108._4_4_ = (float)auVar30._0_4_;
        auVar108._8_4_ = (float)(int)uVar42;
        auVar108._12_4_ = (float)uVar65;
        local_268 = divps(_DAT_001869f0,auVar108);
        auVar122[0] = -((undefined1)uVar76 == 0);
        auVar122[1] = -((undefined1)uVar76 == 0);
        auVar122[2] = -((undefined1)uVar76 == 0);
        auVar122[3] = -((undefined1)uVar76 == 0);
        auVar122[4] = -(uVar20 == '\0');
        auVar122[5] = -(uVar20 == '\0');
        auVar122[6] = -(uVar20 == '\0');
        auVar122[7] = -(uVar20 == '\0');
        auVar122[8] = -(cVar110 == auVar116[8]);
        auVar122[9] = -(cVar110 == auVar116[9]);
        auVar122[10] = -(cVar110 == auVar116[10]);
        auVar122[0xb] = -(cVar110 == auVar116[0xb]);
        auVar122[0xc] = -(cVar111 == auVar116[0xc]);
        auVar122[0xd] = -(cVar111 == auVar116[0xd]);
        auVar122[0xe] = -(cVar111 == auVar116[0xe]);
        auVar122[0xf] = -(cVar111 == auVar116[0xf]);
        Var32 = CONCAT64(CONCAT42(CONCAT22(sVar25,sVar25),sVar24),CONCAT22(sVar24,sVar25));
        auVar31._4_8_ = (long)((unkuint10)Var32 >> 0x10);
        auVar31._2_2_ = 1 - uVar64;
        auVar31._0_2_ = 1 - uVar64;
        auVar117._0_4_ = (float)(int)(short)(1 - auVar106._0_2_);
        auVar117._4_4_ = (float)(auVar31._0_4_ >> 0x10);
        auVar117._8_4_ = (float)((int)((unkuint10)Var32 >> 0x10) >> 0x10);
        auVar117._12_4_ = (float)(int)sVar25;
        local_298 = local_248 * auVar108._0_4_;
        local_2a8 = local_248 * auVar108._4_4_;
        fStack_290 = local_248 * auVar108._8_4_;
        fStack_28c = local_248 * auVar108._12_4_;
        auVar109._0_4_ = auVar108._0_4_ + auVar108._0_4_;
        auVar109._4_4_ = auVar108._4_4_ + auVar108._4_4_;
        auVar109._8_4_ = auVar108._8_4_ + auVar108._8_4_;
        auVar109._12_4_ = auVar108._12_4_ + auVar108._12_4_;
        local_258 = divps(auVar117,auVar109);
        local_258 = ~auVar122 & local_258;
        lVar100 = (long)(int)lVar100;
        fVar103 = local_2a8;
        if (local_298 <= local_2a8) {
          fVar103 = local_298;
        }
        fVar103 = (0.35 / fVar103) * (0.35 / fVar103);
        fStack_284 = -local_2a8;
        local_310 = uVar76 & 0xff;
        local_318 = (ulong)((uint)uVar76._1_7_ & 0xff);
        uVar82 = auVar107._0_4_ & 0xff;
        lVar67 = 0;
        fStack_2a4 = local_2a8;
        fStack_2a0 = local_2a8;
        fStack_29c = local_2a8;
        fStack_294 = local_2a8;
        local_288 = local_298;
        fStack_280 = local_298;
        fStack_27c = fStack_284;
        uStack_244 = uVar112;
        uStack_240 = uVar113;
        uStack_23c = uVar114;
LAB_00130b7e:
        if (lVar67 < (pIVar99->PackRange).num_chars) {
          if (psVar95[lVar100].was_packed != 0) {
            piVar81 = (pIVar99->PackRange).array_of_unicode_codepoints;
            if (piVar81 == (int *)0x0) {
              iVar53 = (pIVar99->PackRange).first_unicode_codepoint_in_range + (int)lVar67;
            }
            else {
              iVar53 = piVar81[lVar67];
            }
            local_338 = (pIVar99->PackRange).chardata_for_range + lVar67;
            local_330 = lVar67;
            local_328 = lVar100;
            iVar54 = stbtt_FindGlyphIndex(&pIVar99->FontInfo,iVar53);
            fVar104 = auVar116._0_4_;
            psVar44 = psVar95 + lVar100;
            uVar1 = psVar44->w;
            uVar5 = psVar44->h;
            uVar6 = psVar44->x;
            uVar8 = psVar44->y;
            psVar44 = psVar95 + lVar100;
            psVar44->w = uVar1 - local_278._0_2_;
            psVar44->h = uVar5 - local_278._2_2_;
            psVar44->x = uVar6 + local_278._4_2_;
            psVar44->y = uVar8 + local_278._6_2_;
            puVar79 = (pIVar99->FontInfo).data;
            uVar65 = *(ushort *)(puVar79 + (long)(pIVar99->FontInfo).hhea + 0x22) << 8 |
                     *(ushort *)(puVar79 + (long)(pIVar99->FontInfo).hhea + 0x22) >> 8;
            iVar53 = (pIVar99->FontInfo).hmtx;
            lVar67 = (ulong)uVar65 * 4 + (long)iVar53 + -4;
            lVar85 = (ulong)uVar65 * 4 + (long)iVar53 + -3;
            if (iVar54 < (int)(uint)uVar65) {
              lVar67 = (long)(iVar54 * 4) + (long)iVar53;
              lVar85 = (long)(iVar54 * 4) + 1 + (long)iVar53;
            }
            bVar10 = puVar79[lVar67];
            bVar11 = puVar79[lVar85];
            auVar116 = local_278;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar99->FontInfo,iVar54,local_298,local_2a8,local_278._0_4_,fVar104,&x0_1,
                       &y0_1,&x1_1,&local_2b0);
            fVar105 = auVar116._0_4_;
            uVar65 = psVar95[lVar100].x;
            uVar14 = psVar95[lVar100].y;
            uVar15 = psVar95[lVar100].w;
            uVar16 = psVar95[lVar100].h;
            uVar72 = stbtt_GetGlyphShape(&pIVar99->FontInfo,iVar54,(stbtt_vertex **)&fdarrayoff);
            uVar74 = (uVar15 - uVar82) + 1;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (&pIVar99->FontInfo,iVar54,local_298,local_2a8,fVar105,fVar104,&y1,&iy0,
                       (int *)0x0,(int *)0x0);
            iVar53 = iy0;
            iVar54 = y1;
            if ((uVar74 != 0) && (iVar56 = ((uint)uVar16 - (uint)uVar64) + 1, iVar56 != 0)) {
              iVar55 = uVar15 - uVar82;
              lVar67 = CONCAT44(uStack_414,fdarrayoff);
              uVar83 = 0;
              uVar76 = (ulong)uVar72;
              if ((int)uVar72 < 1) {
                uVar76 = uVar83;
              }
              uVar69 = 0;
              for (; uVar76 * 0xe - uVar83 != 0; uVar83 = uVar83 + 0xe) {
                uVar69 = (ulong)((int)uVar69 + (uint)(*(char *)(lVar67 + 0xc + uVar83) == '\x01'));
              }
              if (((int)uVar69 != 0) &&
                 (ptr_00 = ImGui::MemAlloc(uVar69 * 4), ptr_00 != (void *)0x0)) {
                local_420 = (stbtt__point *)0x0;
                iVar94 = 0;
                iVar75 = 0;
                iVar98 = 0;
                do {
                  if (iVar75 == 1) {
                    local_420 = (stbtt__point *)ImGui::MemAlloc((long)iVar98 << 3);
                    if (local_420 == (stbtt__point *)0x0) {
                      ImGui::MemFree((void *)0x0);
                      ImGui::MemFree(ptr_00);
                      break;
                    }
                  }
                  else if (iVar75 == 2) goto LAB_00131011;
                  x0 = 0;
                  fVar104 = 0.0;
                  fVar105 = 0.0;
                  uVar72 = 0xffffffff;
                  for (lVar85 = 0; uVar76 * 0xe - lVar85 != 0; lVar85 = lVar85 + 0xe) {
                    iVar98 = x0;
                    switch(*(undefined1 *)(lVar67 + 0xc + lVar85)) {
                    case 1:
                      if (-1 < (int)uVar72) {
                        *(int *)((long)ptr_00 + (ulong)uVar72 * 4) = x0 - iVar94;
                      }
                      uVar72 = uVar72 + 1;
                      auVar116 = pshuflw(ZEXT416(*(uint *)(lVar67 + lVar85)),
                                         ZEXT416(*(uint *)(lVar67 + lVar85)),0x60);
                      fVar104 = (float)(auVar116._0_4_ >> 0x10);
                      fVar105 = (float)(auVar116._4_4_ >> 0x10);
                      iVar94 = x0;
                      iVar98 = x0 + 1;
                      if (local_420 != (stbtt__point *)0x0) {
                        local_420[x0].x = fVar104;
                        local_420[x0].y = fVar105;
                      }
                      break;
                    case 2:
                      auVar116 = pshuflw(ZEXT416(*(uint *)(lVar67 + lVar85)),
                                         ZEXT416(*(uint *)(lVar67 + lVar85)),0x60);
                      fVar104 = (float)(auVar116._0_4_ >> 0x10);
                      fVar105 = (float)(auVar116._4_4_ >> 0x10);
                      iVar98 = x0 + 1;
                      if (local_420 != (stbtt__point *)0x0) {
                        local_420[x0].x = fVar104;
                        local_420[x0].y = fVar105;
                      }
                      break;
                    case 3:
                      stbtt__tesselate_curve
                                (local_420,&x0,fVar104,fVar105,
                                 (float)(int)*(short *)(lVar67 + 4 + lVar85),
                                 (float)(int)*(short *)(lVar67 + 6 + lVar85),
                                 (float)(int)*(short *)(lVar67 + lVar85),
                                 (float)(int)*(short *)(lVar67 + 2 + lVar85),fVar103,0);
                      goto LAB_00130f90;
                    case 4:
                      stbtt__tesselate_cubic
                                (local_420,&x0,fVar104,fVar105,
                                 (float)(int)*(short *)(lVar67 + 4 + lVar85),
                                 (float)(int)*(short *)(lVar67 + 6 + lVar85),
                                 (float)(int)*(short *)(lVar67 + 8 + lVar85),
                                 (float)(int)*(short *)(lVar67 + 10 + lVar85),
                                 (float)(int)*(short *)(lVar67 + lVar85),
                                 (float)(int)*(short *)(lVar67 + 2 + lVar85),fVar103,0);
LAB_00130f90:
                      auVar116 = pshuflw(ZEXT416(*(uint *)(lVar67 + lVar85)),
                                         ZEXT416(*(uint *)(lVar67 + lVar85)),0x60);
                      fVar104 = (float)(auVar116._0_4_ >> 0x10);
                      fVar105 = (float)(auVar116._4_4_ >> 0x10);
                      iVar98 = x0;
                    }
                    x0 = iVar98;
                  }
                  *(int *)((long)ptr_00 + (long)(int)uVar72 * 4) = x0 - iVar94;
                  iVar75 = iVar75 + 1;
                  iVar98 = x0;
                } while( true );
              }
            }
            goto LAB_00131b31;
          }
          goto LAB_001320cf;
        }
        bVar102 = false;
      }
      fVar103 = local_2e8[local_348].RasterizerMultiply;
      if ((fVar103 != 1.0) || (NAN(fVar103))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&x0,fVar103);
        piVar81 = &pIVar99->Rects->was_packed;
        for (iVar53 = 0; iVar53 < pIVar99->GlyphsCount; iVar53 = iVar53 + 1) {
          if (*piVar81 != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&x0,local_488->TexPixelsAlpha8,(uint)*(ushort *)(piVar81 + -1),
                       (uint)*(stbrp_coord *)((long)piVar81 + -2),(uint)*(ushort *)(piVar81 + -2),
                       (uint)*(stbrp_coord *)((long)piVar81 + -6),local_488->TexWidth);
          }
          piVar81 = piVar81 + 4;
        }
        auVar116 = ZEXT816(0);
      }
      pIVar99->Rects = (stbrp_rect *)0x0;
    }
    lVar100 = local_348 + 1;
  }
  ImGui::MemFree(local_2f0);
  ImGui::MemFree(local_358);
  ImVector<stbrp_rect>::clear(&buf_rects);
  lVar77 = 0;
  while( true ) {
    pIVar97 = local_488;
    uVar76 = (ulong)src_tmp_array.Size;
    if ((long)uVar76 <= lVar77) break;
    if (src_tmp_array.Data[lVar77].GlyphsCount != 0) {
      pIVar99 = src_tmp_array.Data + lVar77;
      pIVar90 = (local_488->ConfigData).Data;
      font = pIVar90[lVar77].DstFont;
      fVar103 = stbtt_ScaleForPixelHeight(&pIVar99->FontInfo,pIVar90[lVar77].SizePixels);
      puVar60 = (pIVar99->FontInfo).data;
      lVar100 = (long)(pIVar99->FontInfo).hhea;
      uVar64 = *(ushort *)(puVar60 + lVar100 + 4);
      uVar64 = uVar64 << 8 | uVar64 >> 8;
      fVar104 = -1.0;
      if (0 < (short)uVar64) {
        fVar104 = 1.0;
      }
      uVar65 = *(ushort *)(puVar60 + lVar100 + 6);
      uVar65 = uVar65 << 8 | uVar65 >> 8;
      fVar105 = -1.0;
      if (0 < (short)uVar65) {
        fVar105 = 1.0;
      }
      pIVar90 = pIVar90 + lVar77;
      ImFontAtlasBuildSetupFont
                (local_488,font,pIVar90,(float)(int)((float)(int)(short)uVar64 * fVar103 + fVar104),
                 (float)(int)((float)(int)(short)uVar65 * fVar103 + fVar105));
      fVar103 = (pIVar90->GlyphOffset).x;
      fVar104 = (float)(int)(font->Ascent + 0.5) + (pIVar90->GlyphOffset).y;
      lVar67 = 0;
      for (lVar100 = 0; lVar100 < pIVar99->GlyphsCount; lVar100 = lVar100 + 1) {
        psVar19 = pIVar99->PackedChars;
        fVar105 = *(float *)((long)&psVar19->xadvance + lVar67);
        fVar125 = pIVar90->GlyphMaxAdvanceX;
        if (fVar105 <= pIVar90->GlyphMaxAdvanceX) {
          fVar125 = fVar105;
        }
        uVar82 = -(uint)(fVar105 < pIVar90->GlyphMinAdvanceX);
        fVar125 = (float)(uVar82 & (uint)pIVar90->GlyphMinAdvanceX | ~uVar82 & (uint)fVar125);
        if ((fVar105 != fVar125) || (fVar118 = fVar103, NAN(fVar105) || NAN(fVar125))) {
          fVar118 = (fVar125 - fVar105) * 0.5;
          if (pIVar90->PixelSnapH != false) {
            fVar118 = (float)(int)fVar118;
          }
          fVar118 = fVar118 + fVar103;
        }
        fVar115 = 1.0 / (float)local_488->TexHeight;
        fVar105 = 1.0 / (float)local_488->TexWidth;
        ImFont::AddGlyph(font,(ImWchar)(pIVar99->GlyphsList).Data[lVar100],
                         *(float *)((long)&psVar19->xoff + lVar67) + 0.0 + fVar118,
                         *(float *)((long)&psVar19->yoff + lVar67) + 0.0 + fVar104,
                         *(float *)((long)&psVar19->xoff2 + lVar67) + 0.0 + fVar118,
                         *(float *)((long)&psVar19->yoff2 + lVar67) + 0.0 + fVar104,
                         (float)*(ushort *)((long)&psVar19->x0 + lVar67) * fVar105,
                         (float)*(ushort *)((long)&psVar19->y0 + lVar67) * fVar115,
                         (float)*(ushort *)((long)&psVar19->x1 + lVar67) * fVar105,
                         (float)*(ushort *)((long)&psVar19->y1 + lVar67) * fVar115,fVar125);
        lVar67 = lVar67 + 0x1c;
      }
    }
    lVar77 = lVar77 + 1;
  }
  lVar77 = 0;
  for (lVar100 = 0; lVar100 < (int)uVar76; lVar100 = lVar100 + 1) {
    ImFontBuildSrcData::~ImFontBuildSrcData
              ((ImFontBuildSrcData *)((long)&((src_tmp_array.Data)->FontInfo).userdata + lVar77));
    uVar76 = src_tmp_array._0_8_ & 0xffffffff;
    lVar77 = lVar77 + 0x110;
  }
  ImFontAtlasBuildFinish(pIVar97);
  ImVector<stbtt_packedchar>::~ImVector(&buf_packedchars);
  ImVector<stbrp_rect>::~ImVector(&buf_rects);
LAB_00132469:
  bVar102 = local_2e0 <= local_350;
  ImVector<ImFontBuildDstData>::~ImVector(&dst_tmp_array);
  ImVector<ImFontBuildSrcData>::~ImVector(&src_tmp_array);
  return bVar102;
LAB_00131011:
  if (local_420 != (stbtt__point *)0x0) {
    iVar94 = 0;
    for (uVar76 = 0; uVar69 != uVar76; uVar76 = uVar76 + 1) {
      iVar94 = iVar94 + *(int *)((long)ptr_00 + uVar76 * 4);
    }
    p_00 = (stbtt__edge *)ImGui::MemAlloc((long)(iVar94 + 1) * 0x14);
    if (p_00 != (stbtt__edge *)0x0) {
      iVar94 = 0;
      iVar98 = 0;
      for (uVar76 = 0; uVar76 != uVar69; uVar76 = uVar76 + 1) {
        iVar75 = *(int *)((long)ptr_00 + uVar76 * 4);
        uVar87 = (ulong)(iVar75 - 1);
        iVar93 = iVar75;
        for (uVar83 = 0; iVar91 = (int)uVar87, (long)uVar83 < (long)iVar93; uVar83 = uVar83 + 1) {
          fVar104 = local_420[(long)iVar94 + (long)iVar91].y;
          fVar105 = local_420[(long)iVar94 + uVar83].y;
          if ((fVar104 != fVar105) || (NAN(fVar104) || NAN(fVar105))) {
            iVar92 = (int)uVar83;
            iVar93 = iVar91;
            if (fVar104 <= fVar105) {
              iVar93 = iVar92;
              iVar92 = iVar91;
            }
            p_00[iVar98].invert = (uint)(fVar105 < fVar104);
            sVar3 = local_420[(long)iVar94 + (long)iVar93];
            sVar4 = local_420[(long)iVar94 + (long)iVar92];
            psVar73 = p_00 + iVar98;
            psVar73->x0 = sVar3.x * local_288 + 0.0;
            psVar73->y0 = sVar3.y * fStack_284 + 0.0;
            psVar73->x1 = sVar4.x * fStack_280 + 0.0;
            psVar73->y1 = sVar4.y * fStack_27c + 0.0;
            iVar98 = iVar98 + 1;
            iVar93 = *(int *)((long)ptr_00 + uVar76 * 4);
          }
          uVar87 = uVar83 & 0xffffffff;
        }
        iVar94 = iVar75 + iVar94;
      }
      stbtt__sort_edges_quicksort(p_00,iVar98);
      psVar73 = p_00;
      for (uVar76 = 1; (long)uVar76 < (long)iVar98; uVar76 = uVar76 + 1) {
        uVar2 = p_00[uVar76].x0;
        uVar7 = p_00[uVar76].y0;
        uStack_230 = p_00[uVar76].invert;
        uVar17 = p_00[uVar76].x1;
        uVar22 = p_00[uVar76].y1;
        psVar84 = psVar73;
        for (uVar83 = uVar76; 0 < (long)uVar83; uVar83 = uVar83 - 1) {
          if (psVar84->y0 <= (float)uVar7) goto LAB_001311ce;
          psVar84[1].invert = psVar84->invert;
          fVar104 = psVar84->y0;
          fVar105 = psVar84->x1;
          fVar125 = psVar84->y1;
          psVar84[1].x0 = psVar84->x0;
          psVar84[1].y0 = fVar104;
          psVar84[1].x1 = fVar105;
          psVar84[1].y1 = fVar125;
          psVar84 = psVar84 + -1;
        }
        uVar83 = 0;
LAB_001311ce:
        iVar94 = (int)uVar83;
        if (uVar76 != (uVar83 & 0xffffffff)) {
          p_00[iVar94].x0 = (float)uVar2;
          p_00[iVar94].y0 = (float)uVar7;
          p_00[iVar94].x1 = (float)uVar17;
          p_00[iVar94].y1 = (float)uVar22;
          p_00[iVar94].invert = uStack_230;
        }
        psVar73 = psVar73 + 1;
        x0 = uVar17;
        uStack_234 = uVar22;
      }
      _charstrings = (stbtt__active_edge *)0x0;
      scanline_00 = (float *)&x0;
      if (0x3f < iVar55) {
        scanline_00 = (float *)ImGui::MemAlloc((ulong)uVar74 * 8 + 4);
      }
      local_2c8 = (long)(int)uVar74;
      scanline = scanline_00 + local_2c8;
      p_00[iVar98].y0 = (float)(iVar53 + iVar56) + 1.0;
      local_2b8 = local_2c8 * 4;
      local_2c0 = (long)iVar55 * 4 + 8;
      local_40c = (float)(int)uVar74;
      if ((int)uVar74 < 1) {
        uVar74 = 0;
      }
      local_2d0 = 0;
      if (0 < local_2c8) {
        local_2d0 = local_2c8;
      }
      iVar55 = 0;
      if (iVar56 < 1) {
        iVar56 = 0;
      }
      psVar78 = (stbtt__active_edge *)0x0;
      local_410 = 0;
      local_3c0 = (undefined8 *)0x0;
      local_320 = p_00;
      for (iVar94 = 0; iVar94 != iVar56; iVar94 = iVar94 + 1) {
        fVar104 = (float)iVar53;
        memset(scanline_00,0,local_2b8);
        memset(scanline,0,local_2c0);
        psVar62 = (stbtt__active_edge *)&charstrings;
        while (psVar70 = psVar62, psVar18 = psVar70->next, psVar18 != (stbtt__active_edge *)0x0) {
          psVar62 = psVar18;
          if (psVar18->ey <= fVar104) {
            psVar70->next = psVar18->next;
            psVar18->direction = 0.0;
            psVar18->next = psVar78;
            psVar62 = psVar70;
            psVar78 = psVar18;
          }
        }
        fVar105 = fVar104 + 1.0;
        for (psVar73 = local_320; fVar125 = psVar73->y0, fVar125 <= fVar105; psVar73 = psVar73 + 1)
        {
          fVar118 = psVar73->y1;
          if ((fVar125 != fVar118) || (NAN(fVar125) || NAN(fVar118))) {
            if (psVar78 == (stbtt__active_edge *)0x0) {
              if (local_410 == 0) {
                puVar61 = (undefined8 *)ImGui::MemAlloc(0x6408);
                if (puVar61 == (undefined8 *)0x0) {
                  psVar78 = (stbtt__active_edge *)0x0;
                  local_410 = 0;
                  goto LAB_001314fa;
                }
                *puVar61 = local_3c0;
                fVar125 = psVar73->y0;
                fVar118 = psVar73->y1;
                local_410 = 799;
              }
              else {
                local_410 = local_410 + -1;
                puVar61 = local_3c0;
              }
              psVar78 = (stbtt__active_edge *)(puVar61 + (long)local_410 * 4 + 1);
              psVar62 = (stbtt__active_edge *)0x0;
              local_3c0 = puVar61;
            }
            else {
              psVar62 = psVar78->next;
            }
            fVar115 = psVar73->x0;
            fVar119 = (psVar73->x1 - fVar115) / (fVar118 - fVar125);
            psVar78->fdx = fVar119;
            psVar78->fdy = (float)(-(uint)(fVar119 != 0.0) & (uint)(1.0 / fVar119));
            psVar78->fx = ((fVar104 - fVar125) * fVar119 + fVar115) - (float)iVar54;
            psVar78->direction = *(float *)(&DAT_001881b0 + (ulong)(psVar73->invert == 0) * 4);
            psVar78->sy = fVar125;
            psVar78->ey = fVar118;
            psVar78->next = (stbtt__active_edge *)0x0;
            psVar78->next = _charstrings;
            _charstrings = psVar78;
            psVar78 = psVar62;
          }
LAB_001314fa:
        }
        local_320 = psVar73;
        psVar62 = _charstrings;
        if (_charstrings != (stbtt__active_edge *)0x0) {
          for (; psVar62 != (stbtt__active_edge *)0x0; psVar62 = psVar62->next) {
            fVar125 = psVar62->fx;
            fVar118 = psVar62->fdx;
            if ((fVar118 != 0.0) || (NAN(fVar118))) {
              fVar124 = fVar118 + fVar125;
              fVar115 = psVar62->sy;
              fVar119 = (float)(~-(uint)(fVar104 < fVar115) & (uint)fVar125 |
                               (uint)((fVar115 - fVar104) * fVar118 + fVar125) &
                               -(uint)(fVar104 < fVar115));
              if (0.0 <= fVar119) {
                fVar120 = psVar62->ey;
                fVar123 = (float)(-(uint)(fVar120 < fVar105) &
                                  (uint)((fVar120 - fVar104) * fVar118 + fVar125) |
                                 ~-(uint)(fVar120 < fVar105) & (uint)fVar124);
                if (((0.0 <= fVar123) && (fVar119 < local_40c)) && (fVar123 < local_40c)) {
                  if (fVar115 <= fVar104) {
                    fVar115 = fVar104;
                  }
                  iVar98 = (int)fVar119;
                  if (fVar105 <= fVar120) {
                    fVar120 = fVar105;
                  }
                  iVar75 = (int)fVar123;
                  if (iVar98 == iVar75) {
                    lVar67 = (long)iVar98;
                    scanline_00[lVar67] =
                         (((fVar123 - (float)iVar98) + (fVar119 - (float)iVar98)) * -0.5 + 1.0) *
                         psVar62->direction * (fVar120 - fVar115) + scanline_00[lVar67];
                    fVar125 = (fVar120 - fVar115) * psVar62->direction;
                  }
                  else {
                    fVar118 = psVar62->fdy;
                    fVar121 = fVar123;
                    iVar93 = iVar98;
                    if (fVar123 < fVar119) {
                      fVar125 = fVar104 - fVar115;
                      fVar115 = (fVar104 - fVar120) + fVar105;
                      fVar118 = -fVar118;
                      fVar121 = fVar119;
                      fVar120 = fVar125 + fVar105;
                      iVar93 = iVar75;
                      iVar75 = iVar98;
                      fVar125 = fVar124;
                      fVar119 = fVar123;
                    }
                    iVar98 = iVar93 + 1;
                    fVar123 = ((float)iVar98 - fVar125) * fVar118 + fVar104;
                    fVar125 = psVar62->direction;
                    fVar124 = (fVar123 - fVar115) * fVar125;
                    scanline_00[iVar93] =
                         (1.0 - ((fVar119 - (float)iVar93) + 1.0) * 0.5) * fVar124 +
                         scanline_00[iVar93];
                    lVar67 = (long)iVar75;
                    for (lVar85 = (long)iVar98; lVar85 < lVar67; lVar85 = lVar85 + 1) {
                      scanline_00[lVar85] = fVar118 * fVar125 * 0.5 + fVar124 + scanline_00[lVar85];
                      fVar124 = fVar124 + fVar118 * fVar125;
                    }
                    scanline_00[lVar67] =
                         (fVar120 - (fVar118 * (float)(iVar75 - iVar98) + fVar123)) *
                         (((fVar121 - (float)iVar75) + 0.0) * -0.5 + 1.0) * fVar125 + fVar124 +
                         scanline_00[lVar67];
                    fVar125 = (fVar120 - fVar115) * fVar125;
                  }
                  scanline[lVar67 + 1] = fVar125 + scanline[lVar67 + 1];
                  goto LAB_00131a09;
                }
              }
              local_308 = fVar125;
              uStack_304 = 0;
              uStack_300 = 0;
              uStack_2fc = 0;
              uVar72 = 0;
              while (uVar74 != uVar72) {
                fVar115 = (float)(int)uVar72;
                fVar119 = (float)(int)(uVar72 + 1);
                fVar125 = (fVar115 - local_308) / fVar118 + fVar104;
                fVar120 = (fVar119 - local_308) / fVar118 + fVar104;
                if ((fVar115 <= local_308) || (fVar124 <= fVar119)) {
                  if ((fVar115 <= fVar124) || (local_308 <= fVar119)) {
                    fVar123 = fVar104;
                    fVar121 = local_308;
                    if (((fVar115 <= local_308) || (fVar124 <= fVar115)) &&
                       ((fVar115 <= fVar124 || (local_308 <= fVar115)))) {
                      fVar125 = fVar104;
                      fVar115 = local_308;
                      if (((local_308 < fVar119) && (fVar119 < fVar124)) ||
                         ((fVar124 < fVar119 && (fVar119 < local_308)))) goto LAB_00131717;
                      goto LAB_001317c5;
                    }
                  }
                  else {
                    stbtt__handle_clipped_edge
                              (scanline_00,uVar72,psVar62,local_308,fVar104,fVar119,fVar120);
                    fVar123 = fVar120;
                    fVar121 = fVar119;
                  }
                  stbtt__handle_clipped_edge
                            (scanline_00,uVar72,psVar62,fVar121,fVar123,fVar115,fVar125);
                }
                else {
                  stbtt__handle_clipped_edge
                            (scanline_00,uVar72,psVar62,local_308,fVar104,fVar115,fVar125);
LAB_00131717:
                  stbtt__handle_clipped_edge
                            (scanline_00,uVar72,psVar62,fVar115,fVar125,fVar119,fVar120);
                  fVar125 = fVar120;
                  fVar115 = fVar119;
                }
LAB_001317c5:
                stbtt__handle_clipped_edge
                          (scanline_00,uVar72,psVar62,fVar115,fVar125,fVar124,fVar105);
                uVar72 = uVar72 + 1;
              }
            }
            else if (fVar125 < local_40c) {
              if (0.0 <= fVar125) {
                uStack_304 = 0;
                uStack_300 = 0;
                uStack_2fc = 0;
                local_308 = fVar125;
                stbtt__handle_clipped_edge
                          (scanline_00,(int)fVar125,psVar62,fVar125,fVar104,fVar125,fVar105);
                iVar98 = (int)fVar125 + 1;
                fVar125 = local_308;
              }
              else {
                iVar98 = 0;
              }
              stbtt__handle_clipped_edge(scanline,iVar98,psVar62,fVar125,fVar104,fVar125,fVar105);
            }
LAB_00131a09:
          }
        }
        fVar104 = 0.0;
        lVar67 = local_2d0;
        pfVar71 = scanline_00;
        iVar98 = iVar55;
        while (bVar102 = lVar67 != 0, lVar67 = lVar67 + -1, bVar102) {
          fVar104 = fVar104 + pfVar71[local_2c8];
          iVar75 = (int)(ABS(*pfVar71 + fVar104) * 255.0 + 0.5);
          if (0xfe < iVar75) {
            iVar75 = 0xff;
          }
          puVar60[(long)iVar98 + (ulong)uVar14 * lVar77 + (ulong)uVar65] = (uchar)iVar75;
          iVar98 = iVar98 + 1;
          pfVar71 = pfVar71 + 1;
        }
        psVar63 = &charstrings;
        while (psVar63 = *(stbtt_uint32 **)psVar63, psVar63 != (stbtt_uint32 *)0x0) {
          psVar63[2] = (stbtt_uint32)((float)psVar63[3] + (float)psVar63[2]);
        }
        iVar53 = iVar53 + 1;
        iVar55 = iVar55 + local_490;
      }
      while (local_3c0 != (undefined8 *)0x0) {
        puVar61 = (undefined8 *)*local_3c0;
        ImGui::MemFree(local_3c0);
        local_3c0 = puVar61;
      }
      if (scanline_00 != (float *)&x0) {
        ImGui::MemFree(scanline_00);
      }
      ImGui::MemFree(p_00);
    }
    ImGui::MemFree(ptr_00);
    ImGui::MemFree(local_420);
  }
LAB_00131b31:
  ImGui::MemFree((void *)CONCAT44(uStack_414,fdarrayoff));
  uVar74._0_2_ = psVar95[lVar100].x;
  uVar74._2_2_ = psVar95[lVar100].y;
  uVar72._0_2_ = psVar95[lVar100].w;
  uVar72._2_2_ = psVar95[lVar100].h;
  if (1 < (byte)local_310) {
    lVar67 = (long)(int)((uVar74 >> 0x10) * local_490);
    puVar79 = puVar60 + lVar67 + (ulong)(ushort)(undefined2)uVar74;
    iVar53 = (uVar72 & 0xffff) - uVar82;
    x0 = 0;
    uStack_234 = 0;
    if (iVar53 < 0) {
      iVar53 = -1;
    }
    uVar76 = (long)iVar53 + 1;
    puVar101 = local_2d8 + lVar67 + (ulong)(ushort)(undefined2)uVar74 + (long)iVar53;
    for (uVar74 = 0; uVar83 = local_310, uVar74 != uVar72 >> 0x10; uVar74 = uVar74 + 1) {
      memset(&x0,0,local_310);
      puVar88 = puVar101;
      uVar69 = uVar76;
      switch((int)uVar83) {
      case 2:
        uVar83 = 0;
        for (uVar87 = 0; uVar76 != uVar87; uVar87 = uVar87 + 1) {
          bVar12 = puVar79[uVar87];
          bVar13 = *(byte *)((long)&x0 + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar87 + 2 & 7)) = bVar12;
          uVar66 = (int)uVar83 + ((uint)bVar12 - (uint)bVar13);
          uVar83 = (ulong)uVar66;
          puVar79[uVar87] = (uchar)(uVar66 >> 1);
        }
        break;
      case 3:
        uVar83 = 0;
        for (uVar87 = 0; uVar76 != uVar87; uVar87 = uVar87 + 1) {
          bVar12 = puVar79[uVar87];
          bVar13 = *(byte *)((long)&x0 + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar87 + 3 & 7)) = bVar12;
          uVar83 = (ulong)((int)uVar83 + ((uint)bVar12 - (uint)bVar13));
          puVar79[uVar87] = (uchar)(uVar83 / 3);
        }
        break;
      case 4:
        uVar83 = 0;
        for (uVar87 = 0; uVar76 != uVar87; uVar87 = uVar87 + 1) {
          bVar12 = puVar79[uVar87];
          uVar86 = (ulong)((uint)uVar87 & 7);
          *(byte *)((long)&x0 + (uVar86 ^ 4)) = bVar12;
          uVar66 = (int)uVar83 + ((uint)bVar12 - (uint)*(byte *)((long)&x0 + uVar86));
          uVar83 = (ulong)uVar66;
          puVar79[uVar87] = (uchar)(uVar66 >> 2);
        }
        break;
      case 5:
        uVar83 = 0;
        for (uVar87 = 0; uVar76 != uVar87; uVar87 = uVar87 + 1) {
          bVar12 = puVar79[uVar87];
          bVar13 = *(byte *)((long)&x0 + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar87 + 5 & 7)) = bVar12;
          uVar83 = (ulong)((int)uVar83 + ((uint)bVar12 - (uint)bVar13));
          puVar79[uVar87] = (uchar)(uVar83 / 5);
        }
        break;
      default:
        uVar83 = 0;
        for (uVar87 = 0; uVar76 != uVar87; uVar87 = uVar87 + 1) {
          bVar12 = puVar79[uVar87];
          bVar13 = *(byte *)((long)&x0 + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&x0 + (ulong)(uVar82 + (uint)uVar87 & 7)) = bVar12;
          uVar66 = (int)uVar83 + ((uint)bVar12 - (uint)bVar13);
          uVar83 = (ulong)uVar66;
          puVar79[uVar87] = (uchar)(uVar66 / uVar82);
        }
      }
      for (; uVar69 < (uVar72 & 0xffff); uVar69 = uVar69 + 1) {
        uVar66 = (int)uVar83 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar69 & 7));
        uVar83 = (ulong)uVar66;
        *puVar88 = (uchar)(uVar66 / uVar82);
        puVar88 = puVar88 + 1;
      }
      puVar79 = puVar79 + lVar77;
      puVar101 = puVar101 + lVar77;
    }
    uVar74._0_2_ = psVar95[lVar100].x;
    uVar74._2_2_ = psVar95[lVar100].y;
    uVar72._0_2_ = psVar95[lVar100].w;
    uVar72._2_2_ = psVar95[lVar100].h;
  }
  if (1 < (byte)local_318) {
    lVar67 = (long)(int)((uVar74 >> 0x10) * local_490);
    pbVar80 = puVar60 + lVar67 + (ulong)(ushort)uVar74;
    uVar65 = (ushort)(uVar72 >> 0x10);
    x0 = 0;
    uStack_234 = 0;
    local_458 = (uint)uVar64;
    iVar53 = uVar65 - local_458;
    if (iVar53 < 0) {
      iVar53 = -1;
    }
    uVar76 = (long)iVar53 + 1;
    puVar79 = puVar60 + lVar77 * uVar76 + lVar67 + (ulong)(ushort)uVar74;
    for (uVar74 = 0; uVar83 = local_318, uVar74 != (uVar72 & 0xffff); uVar74 = uVar74 + 1) {
      memset(&x0,0,local_318);
      puVar101 = puVar79;
      uVar69 = uVar76;
      switch((int)uVar83) {
      case 2:
        uVar83 = 0;
        pbVar89 = pbVar80;
        for (uVar87 = 0; uVar76 != uVar87; uVar87 = uVar87 + 1) {
          bVar12 = *pbVar89;
          bVar13 = *(byte *)((long)&x0 + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar87 + 2 & 7)) = bVar12;
          uVar66 = (int)uVar83 + ((uint)bVar12 - (uint)bVar13);
          uVar83 = (ulong)uVar66;
          *pbVar89 = (byte)(uVar66 >> 1);
          pbVar89 = pbVar89 + lVar77;
        }
        break;
      case 3:
        uVar83 = 0;
        pbVar89 = pbVar80;
        for (uVar87 = 0; uVar76 != uVar87; uVar87 = uVar87 + 1) {
          bVar12 = *pbVar89;
          bVar13 = *(byte *)((long)&x0 + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar87 + 3 & 7)) = bVar12;
          uVar83 = (ulong)((int)uVar83 + ((uint)bVar12 - (uint)bVar13));
          *pbVar89 = (byte)(uVar83 / 3);
          pbVar89 = pbVar89 + lVar77;
        }
        break;
      case 4:
        uVar83 = 0;
        pbVar89 = pbVar80;
        for (uVar87 = 0; uVar76 != uVar87; uVar87 = uVar87 + 1) {
          bVar12 = *pbVar89;
          uVar86 = (ulong)((uint)uVar87 & 7);
          *(byte *)((long)&x0 + (uVar86 ^ 4)) = bVar12;
          uVar66 = (int)uVar83 + ((uint)bVar12 - (uint)*(byte *)((long)&x0 + uVar86));
          uVar83 = (ulong)uVar66;
          *pbVar89 = (byte)(uVar66 >> 2);
          pbVar89 = pbVar89 + lVar77;
        }
        break;
      case 5:
        uVar83 = 0;
        pbVar89 = pbVar80;
        for (uVar87 = 0; uVar76 != uVar87; uVar87 = uVar87 + 1) {
          bVar12 = *pbVar89;
          bVar13 = *(byte *)((long)&x0 + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar87 + 5 & 7)) = bVar12;
          uVar83 = (ulong)((int)uVar83 + ((uint)bVar12 - (uint)bVar13));
          *pbVar89 = (byte)(uVar83 / 5);
          pbVar89 = pbVar89 + lVar77;
        }
        break;
      default:
        uVar83 = 0;
        pbVar89 = pbVar80;
        for (uVar87 = 0; uVar76 != uVar87; uVar87 = uVar87 + 1) {
          bVar12 = *pbVar89;
          bVar13 = *(byte *)((long)&x0 + (ulong)((uint)uVar87 & 7));
          *(byte *)((long)&x0 + (ulong)((uint)uVar64 + (uint)uVar87 & 7)) = bVar12;
          uVar66 = (int)uVar83 + ((uint)bVar12 - (uint)bVar13);
          uVar83 = (ulong)uVar66;
          *pbVar89 = (byte)(uVar66 / uVar64);
          pbVar89 = pbVar89 + lVar77;
        }
      }
      for (; uVar69 < uVar65; uVar69 = uVar69 + 1) {
        uVar66 = (int)uVar83 - (uint)*(byte *)((long)&x0 + (ulong)((uint)uVar69 & 7));
        uVar83 = (ulong)uVar66;
        *puVar101 = (uchar)(uVar66 / local_458);
        puVar101 = puVar101 + lVar77;
      }
      pbVar80 = pbVar80 + 1;
      puVar79 = puVar79 + 1;
    }
    uVar74._0_2_ = psVar95[lVar100].x;
    uVar74._2_2_ = psVar95[lVar100].y;
    uVar72._0_2_ = psVar95[lVar100].w;
    uVar72._2_2_ = psVar95[lVar100].h;
  }
  auVar116 = (undefined1  [16])0x0;
  local_338->x0 = (short)uVar74;
  local_338->y0 = (short)(uVar74 >> 0x10);
  uVar65 = (ushort)(uVar72 >> 0x10);
  local_338->x1 = (short)uVar74 + (short)uVar72;
  local_338->y1 = (short)(uVar74 >> 0x10) + uVar65;
  local_338->xadvance = (float)(int)(short)((ushort)bVar10 * 0x100 + (ushort)bVar11) * local_248;
  local_338->xoff = (float)x0_1 * local_268._0_4_ + (float)local_258._0_4_;
  local_338->yoff = (float)y0_1 * local_268._4_4_ + (float)local_258._4_4_;
  local_338->xoff2 =
       (float)(int)((uVar72 & 0xffff) + x0_1) * local_268._0_4_ + (float)local_258._0_4_;
  local_338->yoff2 = (float)(int)((uint)uVar65 + y0_1) * local_268._4_4_ + (float)local_258._4_4_;
  lVar67 = local_330;
  lVar100 = local_328;
  psVar95 = local_340;
LAB_001320cf:
  lVar100 = lVar100 + 1;
  lVar67 = lVar67 + 1;
  goto LAB_00130b7e;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildRegisterDefaultCustomRects(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.GlyphsSet.Resize(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.SrcCount > 1 && dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Resize(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (cfg.MergeMode && dst_tmp.GlyphsSet.GetBit(codepoint))   // Don't overwrite existing glyphs. We could make this an option (e.g. MergeOverwrite)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;
                
                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint, true);
                if (dst_tmp.SrcCount > 1)
                    dst_tmp.GlyphsSet.SetBit(codepoint, true);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBoolVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096*0.7f) ? 4096 : (surface_sqrt >= 2048*0.7f) ? 2048 : (surface_sqrt >= 1024*0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + (float)(int)(dst_font->Ascent + 0.5f);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];

            const float char_advance_x_org = pc.xadvance;
            const float char_advance_x_mod = ImClamp(char_advance_x_org, cfg.GlyphMinAdvanceX, cfg.GlyphMaxAdvanceX);
            float char_off_x = font_off_x;
            if (char_advance_x_org != char_advance_x_mod)
                char_off_x += cfg.PixelSnapH ? (float)(int)((char_advance_x_mod - char_advance_x_org) * 0.5f) : (char_advance_x_mod - char_advance_x_org) * 0.5f;
            
            // Register glyph
            stbtt_aligned_quad q;
            float dummy_x = 0.0f, dummy_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &dummy_x, &dummy_y, &q, 0);
            dst_font->AddGlyph((ImWchar)codepoint, q.x0 + char_off_x, q.y0 + font_off_y, q.x1 + char_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, char_advance_x_mod);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}